

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U>::
ktxTexture1WriteTestBase(ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U> *this)

{
  undefined8 *in_RDI;
  TextureWriterTestHelper<unsigned_short,_2U,_33324U> *in_stack_fffffffffffffff0;
  
  testing::Test::Test((Test *)in_stack_fffffffffffffff0);
  *in_RDI = &PTR__ktxTexture1WriteTestBase_0020ba18;
  TextureWriterTestHelper<unsigned_short,_2U,_33324U>::TextureWriterTestHelper
            (in_stack_fffffffffffffff0);
  return;
}

Assistant:

ktxTexture1WriteTestBase() { }